

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_connect_op<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
  handler;
  ptr local_38;
  undefined1 local_20 [16];
  error_category *peStack_10;
  
  local_20._0_8_ = *(undefined8 *)&base[2].task_result_;
  local_38.h = (anon_class_8_1_8991fb9c *)local_20;
  local_20._8_8_ = base[1].next_;
  peStack_10 = (error_category *)base[1].func_;
  local_38.v = (reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
                *)base;
  local_38.p = (reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
                *)base;
  ptr::reset(&local_38);
  if (owner != (void *)0x0) {
    asio_handler_invoke_helpers::
    invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
              ((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
                *)local_20,(anon_class_8_1_8991fb9c *)base);
  }
  ptr::reset(&local_38);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_connect_op* o
      (static_cast<reactive_socket_connect_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }